

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_rectangle_outline(rf_rec rec,int line_thick,rf_color color)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  rf_rec rec_00;
  rf_rec rec_01;
  rf_rec rec_02;
  rf_rec rec_03;
  
  fVar2 = rec.width;
  fVar3 = rec.height;
  fVar1 = rec.y;
  if (((fVar2 < (float)line_thick) || (fVar3 < (float)line_thick)) &&
     ((fVar4 = fVar3, fVar3 < fVar2 || (fVar4 = fVar2, fVar2 < fVar3)))) {
    line_thick = (int)fVar4 / 2;
  }
  fVar4 = (float)(int)rec.x;
  fVar5 = (float)line_thick;
  rec_00.y = (float)(int)fVar1;
  rec_00.x = fVar4;
  rec_00.height = fVar5;
  rec_00.width = (float)(int)fVar2;
  rf_draw_rectangle_pro(rec_00,(rf_vec2)0x0,0.0,color);
  rec_01.x = (float)(int)((rec.x - fVar5) + fVar2);
  rec_01.y = (float)(int)(fVar5 + fVar1);
  rec_01.height = (float)(int)(fVar3 - (fVar5 + fVar5));
  rec_01.width = fVar5;
  rf_draw_rectangle_pro(rec_01,(rf_vec2)0x0,0.0,color);
  rec_02.height = fVar5;
  rec_02.width = (float)(int)fVar2;
  rec_02.y = (float)(int)((fVar1 + fVar3) - fVar5);
  rec_02.x = fVar4;
  rf_draw_rectangle_pro(rec_02,(rf_vec2)0x0,0.0,color);
  rec_03.y = rec_01.y;
  rec_03.x = fVar4;
  rec_03.height = (float)(int)(fVar3 - (float)(line_thick * 2));
  rec_03.width = fVar5;
  rf_draw_rectangle_pro(rec_03,(rf_vec2)0x0,0.0,color);
  return;
}

Assistant:

RF_API void rf_draw_rectangle_outline(rf_rec rec, int line_thick, rf_color color)
{
    if (line_thick > rec.width || line_thick > rec.height)
    {
        if (rec.width > rec.height) line_thick = (int)rec.height/2;
        else if (rec.width < rec.height) line_thick = (int)rec.width/2;
    }

    rf_draw_rectangle_pro((rf_rec) {(int)rec.x, (int)rec.y, (int)rec.width, line_thick }, (rf_vec2){0.0f, 0.0f}, 0.0f, color);
    rf_draw_rectangle_pro((rf_rec) {(int)(rec.x - line_thick + rec.width), (int)(rec.y + line_thick), line_thick, (int)(rec.height - line_thick * 2.0f) }, (rf_vec2){0.0f, 0.0f}, 0.0f, color);
    rf_draw_rectangle_pro((rf_rec) {(int)rec.x, (int)(rec.y + rec.height - line_thick), (int)rec.width, line_thick }, (rf_vec2){0.0f, 0.0f}, 0.0f, color);
    rf_draw_rectangle_pro((rf_rec) {(int)rec.x, (int)(rec.y + line_thick), line_thick, (int)(rec.height - line_thick * 2) }, (rf_vec2) {0.0f, 0.0f }, 0.0f, color);
}